

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrulematcher.cpp
# Opt level: O2

bool __thiscall QMimeMagicRuleMatcher::matches(QMimeMagicRuleMatcher *this,QByteArray *data)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  QMimeMagicRule *magicRule;
  QMimeMagicRule *this_00;
  
  this_00 = (this->m_list).d.ptr;
  lVar1 = (this->m_list).d.size * 0x88;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0) break;
    bVar2 = QMimeMagicRule::matches(this_00,data);
    this_00 = this_00 + 1;
    lVar1 = lVar3 + -0x88;
  } while (!bVar2);
  return lVar3 != 0;
}

Assistant:

bool QMimeMagicRuleMatcher::matches(const QByteArray &data) const
{
    for (const QMimeMagicRule &magicRule : m_list) {
        if (magicRule.matches(data))
            return true;
    }

    return false;
}